

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiceDriver.cpp
# Opt level: O0

bool test_DiceRoller_getPercentages(void)

{
  int iVar1;
  vector<int,_std::allocator<int>_> *pvVar2;
  DiceRoller *pDVar3;
  reference pvVar4;
  size_type sVar5;
  reference pvVar6;
  bool bVar7;
  double dVar8;
  bool local_c1;
  vector<double,_std::allocator<double>_> local_80;
  double local_68;
  double percent;
  undefined1 local_58 [4];
  int x_1;
  int local_40;
  int local_3c;
  int roll;
  int x;
  DiceRoller *roller;
  allocator<int> local_19;
  vector<int,_std::allocator<int>_> *local_18;
  vector<int,_std::allocator<int>_> *history;
  int timesRolled;
  bool success;
  
  history._7_1_ = 1;
  history._0_4_ = 0;
  pvVar2 = (vector<int,_std::allocator<int>_> *)operator_new(0x18);
  roller._3_1_ = 1;
  std::allocator<int>::allocator(&local_19);
  std::vector<int,_std::allocator<int>_>::vector(pvVar2,6,&local_19);
  roller._3_1_ = 0;
  std::allocator<int>::~allocator(&local_19);
  local_18 = pvVar2;
  pDVar3 = (DiceRoller *)operator_new(0x10);
  DiceRoller::DiceRoller(pDVar3);
  _roll = pDVar3;
  for (local_3c = 0; local_3c < 100; local_3c = local_3c + 1) {
    DiceRoller::roll((vector<int,_std::allocator<int>_> *)local_58,_roll,1);
    pvVar4 = std::vector<int,_std::allocator<int>_>::at
                       ((vector<int,_std::allocator<int>_> *)local_58,0);
    iVar1 = *pvVar4;
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_58);
    history._0_4_ = (int)history + 1;
    local_40 = iVar1;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](local_18,(long)(iVar1 + -1));
    *pvVar4 = *pvVar4 + 1;
  }
  for (percent._4_4_ = 0; iVar1 = percent._4_4_,
      sVar5 = std::vector<int,_std::allocator<int>_>::size(local_18), pvVar2 = local_18,
      iVar1 < (int)sVar5; percent._4_4_ = percent._4_4_ + 1) {
    pvVar4 = std::vector<int,_std::allocator<int>_>::at(local_18,(long)percent._4_4_);
    dVar8 = (double)*pvVar4 / (double)(int)history;
    bVar7 = (history._7_1_ & 1) != 0;
    local_c1 = false;
    local_68 = dVar8;
    if (bVar7) {
      DiceRoller::getPercentages(&local_80,_roll);
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&local_80,(long)percent._4_4_);
      local_c1 = dVar8 == *pvVar6;
    }
    history._7_1_ = local_c1;
    if (bVar7) {
      std::vector<double,_std::allocator<double>_>::~vector(&local_80);
    }
  }
  if (local_18 != (vector<int,_std::allocator<int>_> *)0x0) {
    std::vector<int,_std::allocator<int>_>::~vector(local_18);
    operator_delete(pvVar2,0x18);
  }
  pDVar3 = _roll;
  if (_roll != (DiceRoller *)0x0) {
    DiceRoller::~DiceRoller(_roll);
    operator_delete(pDVar3,0x10);
  }
  return (bool)(history._7_1_ & 1);
}

Assistant:

bool test_DiceRoller_getPercentages() {
    bool success = true;
    int timesRolled = 0;
    auto* history = new std::vector<int>(6);
    auto* roller = new DiceRoller();
    for (int x = 0; x < 100; x++) {
        int roll = roller->roll(1).at(0);
        timesRolled++;
        (*history)[roll - 1]++;
    }

    for (int x = 0; x < (int) history->size(); x++) {
        double percent = (double) history->at(x) / (double) timesRolled;
        success = success && percent == roller->getPercentages()[x];
    }

    delete (history);
    delete (roller);

    return success;
}